

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_sync_handler_failed_application_exception_branch
          (t_rs_generator *this,t_function *tfunc,string *app_err_var)

{
  ostream *poVar1;
  string local_38;
  
  if (tfunc->oneway_ == true) {
    t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_gen_,local_38._M_dataplus._M_p,local_38._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Err(thrift::Error::Application(",0x1f);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(app_err_var->_M_dataplus)._M_p,app_err_var->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"))",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  render_sync_handler_send_exception_response(this,tfunc,app_err_var);
  return;
}

Assistant:

void t_rs_generator::render_sync_handler_failed_application_exception_branch(
    t_function *tfunc,
    const string &app_err_var
) {
  if (tfunc->is_oneway()) {
    f_gen_ << indent() << "Err(thrift::Error::Application(" << app_err_var << "))" << endl;
  } else {
    render_sync_handler_send_exception_response(tfunc, app_err_var);
  }
}